

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

bool __thiscall SQCompiler::NeedGet(SQCompiler *this)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = this->_token;
  uVar1 = lVar2 - 0x119;
  if (uVar1 < 0x27) {
    if ((0x7000000301U >> (uVar1 & 0x3f) & 1) != 0) {
      return false;
    }
    if ((0xc00000UL >> (uVar1 & 0x3f) & 1) != 0) {
      if ((this->_lex)._prevtoken != 10) {
        return false;
      }
      goto LAB_00115720;
    }
  }
  if (lVar2 == 0x28) {
    return false;
  }
  if (lVar2 == 0x3d) {
    return false;
  }
LAB_00115720:
  if ((this->_es).donot_get != true) {
    return true;
  }
  return lVar2 == 0x5b || lVar2 == 0x2e;
}

Assistant:

bool NeedGet()
    {
        switch(_token) {
        case _SC('='): case _SC('('): case TK_NEWSLOT: case TK_MODEQ: case TK_MULEQ:
        case TK_DIVEQ: case TK_MINUSEQ: case TK_PLUSEQ:
            return false;
        case TK_PLUSPLUS: case TK_MINUSMINUS:
            if (!IsEndOfStatement()) {
                return false;
            }
        break;
        }
        return (!_es.donot_get || ( _es.donot_get && (_token == _SC('.') || _token == _SC('['))));
    }